

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall Lib::Stack<Kernel::PolyNf>::expand(Stack<Kernel::PolyNf> *this)

{
  PolyNf *pPVar1;
  ulong uVar2;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  
  sVar5 = 8;
  if (this->_capacity != 0) {
    sVar5 = this->_capacity * 2;
  }
  pPVar1 = (PolyNf *)Lib::alloc(sVar5 * 0x18);
  uVar2 = this->_capacity;
  if (uVar2 == 0) {
    sVar3 = 0;
  }
  else {
    lVar6 = 0;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      CoproductImpl::TrivialOperations::MoveCons::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     *)((pPVar1->super_PolyNfSuper)._inner.
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        .
                        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                        ._content + lVar6 + -1),
                    (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     *)((this->_stack->super_PolyNfSuper)._inner.
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        .
                        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                        ._content + lVar6 + -1));
      uVar2 = this->_capacity;
      lVar6 = lVar6 + 0x18;
    }
    Lib::free(this->_stack);
    sVar3 = this->_capacity;
  }
  this->_stack = pPVar1;
  this->_cursor = pPVar1 + sVar3;
  this->_end = pPVar1 + sVar5;
  this->_capacity = sVar5;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }